

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::
     IntegerCastLoop<duckdb::IntegerDecimalCastData<unsigned_char>,_true,_true,_duckdb::IntegerDecimalCastOperation,____>
               (char *buf,idx_t len,IntegerDecimalCastData<unsigned_char> *result,bool strict)

{
  byte bVar1;
  bool bVar2;
  byte in_CL;
  undefined8 in_RDX;
  IntegerCastData<short> *in_RSI;
  long in_RDI;
  uchar digit;
  int negative;
  ExponentData exponent;
  idx_t start_digit;
  bool number_before_period;
  idx_t pos;
  idx_t start_pos;
  undefined8 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  uchar in_stack_ffffffffffffffaf;
  undefined1 local_4a [2];
  IntegerCastData<short> *local_48;
  byte in_stack_ffffffffffffffc7;
  IntegerCastData<short> *pIVar3;
  IntegerCastData<short> *pIVar4;
  IntegerCastData<short> *len_00;
  int16_t exponent_00;
  undefined7 in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = in_CL & 1;
  len_00 = (IntegerCastData<short> *)0x1;
  pIVar3 = (IntegerCastData<short> *)0x1;
  while( true ) {
    if (in_RSI <= pIVar3) goto LAB_02afc7ee;
    bVar2 = StringUtil::CharacterIsDigit(*(char *)((long)&pIVar3->result + in_RDI));
    if (!bVar2) break;
    pIVar4 = (IntegerCastData<short> *)((long)&pIVar3->result + 1);
    in_stack_ffffffffffffffaf =
         UnsafeNumericCast<unsigned_char,_int,_void>
                   (*(char *)((long)&pIVar3->result + in_RDI) + -0x30);
    bVar2 = IntegerCastOperation::HandleDigit<duckdb::IntegerDecimalCastData<unsigned_char>,_true>
                      ((IntegerDecimalCastData<unsigned_char> *)
                       CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                       (uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
    if (!bVar2) {
      return false;
    }
    pIVar3 = pIVar4;
    if ((((pIVar4 != in_RSI) && (*(char *)((long)&pIVar4->result + in_RDI) == '_')) &&
        ((bVar1 & 1) == 0)) &&
       ((pIVar3 = (IntegerCastData<short> *)((long)&pIVar4->result + 1), pIVar3 == in_RSI ||
        (bVar2 = StringUtil::CharacterIsDigit(*(char *)((long)&pIVar3->result + in_RDI)), !bVar2))))
    {
      return false;
    }
  }
  if (*(char *)((long)&pIVar3->result + in_RDI) != '.') goto LAB_02afc5b2;
  if ((bVar1 & 1) != 0) {
    return false;
  }
  in_stack_ffffffffffffffc7 = len_00 < pIVar3;
  local_48 = (IntegerCastData<short> *)((long)&pIVar3->result + 1);
  pIVar4 = local_48;
  while ((pIVar3 = pIVar4, pIVar3 < in_RSI &&
         (bVar2 = StringUtil::CharacterIsDigit(*(char *)((long)&pIVar3->result + in_RDI)), bVar2)))
  {
    UnsafeNumericCast<unsigned_char,_int,_void>(*(char *)((long)&pIVar3->result + in_RDI) + -0x30);
    bVar2 = IntegerDecimalCastOperation::
            HandleDecimal<duckdb::IntegerDecimalCastData<unsigned_char>,_true,_true>
                      ((IntegerDecimalCastData<unsigned_char> *)
                       CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                       (uint8_t)((ulong)in_RDX >> 0x38));
    if (!bVar2) {
      return false;
    }
    pIVar4 = (IntegerCastData<short> *)((long)&pIVar3->result + 1);
    if (((pIVar4 != in_RSI) && (*(char *)((long)&pIVar4->result + in_RDI) == '_')) &&
       ((pIVar4 = pIVar3 + 1, pIVar4 == in_RSI ||
        (bVar2 = StringUtil::CharacterIsDigit(*(char *)((long)&pIVar4->result + in_RDI)), !bVar2))))
    {
      return false;
    }
  }
  if (((in_stack_ffffffffffffffc7 & 1) == 0) && (pIVar3 <= local_48)) {
    return false;
  }
  if (pIVar3 < in_RSI) {
LAB_02afc5b2:
    bVar2 = StringUtil::CharacterIsSpace(*(char *)((long)&pIVar3->result + in_RDI));
    if (bVar2) {
      do {
        pIVar3 = (IntegerCastData<short> *)((long)&pIVar3->result + 1);
        if (in_RSI <= pIVar3) goto LAB_02afc7ee;
        bVar2 = StringUtil::CharacterIsSpace(*(char *)((long)&pIVar3->result + in_RDI));
      } while (bVar2);
      local_1 = false;
    }
    else if ((*(char *)((long)&pIVar3->result + in_RDI) == 'e') ||
            (*(char *)((long)&pIVar3->result + in_RDI) == 'E')) {
      if ((bVar1 & 1) == 0) {
        if (pIVar3 == len_00) {
          local_1 = false;
        }
        else {
          pIVar3 = (IntegerCastData<short> *)((long)&pIVar3->result + 1);
          if (pIVar3 < in_RSI) {
            memset(local_4a,0,2);
            if (*(char *)((long)&pIVar3->result + in_RDI) == '-') {
              bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,_true,_false,_duckdb::IntegerCastOperation,____>
                                ((char *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),(idx_t)len_00,
                                 pIVar3,(bool)in_stack_ffffffffffffffc7);
              exponent_00 = (int16_t)((ulong)len_00 >> 0x30);
              if (!bVar2) {
                return false;
              }
            }
            else {
              bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,_false,_false,_duckdb::IntegerCastOperation,____>
                                ((char *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),(idx_t)len_00,
                                 pIVar3,(bool)in_stack_ffffffffffffffc7);
              exponent_00 = (int16_t)((ulong)len_00 >> 0x30);
              if (!bVar2) {
                return false;
              }
            }
            local_1 = IntegerDecimalCastOperation::
                      HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,_true>
                                ((IntegerDecimalCastData<unsigned_char> *)
                                 CONCAT17(bVar1,in_stack_ffffffffffffffd8),exponent_00);
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
    return local_1;
  }
LAB_02afc7ee:
  bVar2 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,_true>
                    ((IntegerDecimalCastData<unsigned_char> *)
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if (!bVar2) {
    return false;
  }
  return len_00 < pIVar3;
}

Assistant:

static bool IntegerCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	idx_t start_pos;
	if (NEGATIVE) {
		start_pos = 1;
	} else {
		if (*buf == '+') {
			if (strict) {
				// leading plus is not allowed in strict mode
				return false;
			}
			start_pos = 1;
		} else {
			start_pos = 0;
		}
	}
	idx_t pos = start_pos;
	while (pos < len) {
		if (!StringUtil::CharacterIsDigit(buf[pos])) {
			// not a digit!
			if (buf[pos] == decimal_separator) {
				if (strict) {
					return false;
				}
				bool number_before_period = pos > start_pos;
				// decimal point: we accept decimal values for integers as well
				// we just truncate them
				// make sure everything after the period is a number
				pos++;
				idx_t start_digit = pos;
				while (pos < len) {
					if (!StringUtil::CharacterIsDigit(buf[pos])) {
						break;
					}
					if (!OP::template HandleDecimal<T, NEGATIVE, ALLOW_EXPONENT>(
					        result, UnsafeNumericCast<uint8_t>(buf[pos] - '0'))) {
						return false;
					}
					pos++;

					if (pos != len && buf[pos] == '_') {
						// Skip one underscore if it is not the last character and followed by a digit
						pos++;
						if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
							return false;
						}
					}
				}
				// make sure there is either (1) one number after the period, or (2) one number before the period
				// i.e. we accept "1." and ".1" as valid numbers, but not "."
				if (!(number_before_period || pos > start_digit)) {
					return false;
				}
				if (pos >= len) {
					break;
				}
			}
			if (StringUtil::CharacterIsSpace(buf[pos])) {
				// skip any trailing spaces
				while (++pos < len) {
					if (!StringUtil::CharacterIsSpace(buf[pos])) {
						return false;
					}
				}
				break;
			}
			if (ALLOW_EXPONENT) {
				if (buf[pos] == 'e' || buf[pos] == 'E') {
					if (strict) {
						return false;
					}
					if (pos == start_pos) {
						return false;
					}
					pos++;
					if (pos >= len) {
						return false;
					}
					using ExponentData = IntegerCastData<int16_t>;
					ExponentData exponent {};
					int negative = buf[pos] == '-';
					if (negative) {
						if (!IntegerCastLoop<ExponentData, true, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					} else {
						if (!IntegerCastLoop<ExponentData, false, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					}
					return OP::template HandleExponent<T, NEGATIVE>(result, exponent.result);
				}
			}
			return false;
		}
		auto digit = UnsafeNumericCast<uint8_t>(buf[pos++] - '0');
		if (!OP::template HandleDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}

		if (pos != len && buf[pos] == '_' && !strict) {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
				return false;
			}
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}